

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler.cc
# Opt level: O2

void __thiscall ProfileHandler::~ProfileHandler(ProfileHandler *this)

{
  Reset(this);
  if (this->per_thread_timer_enabled_ == true) {
    pthread_key_delete(this->thread_timer_key);
  }
  std::__cxx11::_List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>::_M_clear
            (&(this->callbacks_).
              super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>);
  return;
}

Assistant:

ProfileHandler::~ProfileHandler() {
  Reset();
#if HAVE_LINUX_SIGEV_THREAD_ID
  if (per_thread_timer_enabled_) {
    pthread_key_delete(thread_timer_key);
  }
#endif
}